

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_api.c
# Opt level: O0

MPP_RET avs2d_flush(void *decoder)

{
  Avs2dCtx_t *p_dec;
  MPP_RET ret;
  void *decoder_local;
  
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_api","In.","avs2d_flush");
  }
  dpb_remove_unused_frame((Avs2dCtx_t *)decoder);
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_api","Out.","avs2d_flush");
  }
  return MPP_OK;
}

Assistant:

MPP_RET avs2d_flush(void *decoder)
{
    MPP_RET ret = MPP_OK;
    Avs2dCtx_t *p_dec = (Avs2dCtx_t *)decoder;
    AVS2D_PARSE_TRACE("In.");

    dpb_remove_unused_frame(p_dec);

    AVS2D_PARSE_TRACE("Out.");
    return ret;
}